

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

string * __thiscall
rcg::(anonymous_namespace)::getBufferString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,BUFFER_INFO_CMD cmd)

{
  int iVar1;
  INFO_DATATYPE type;
  size_t size;
  char tmp [1024];
  int local_434;
  undefined8 local_430;
  undefined1 local_428 [1024];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memset(local_428,0,0x400);
  local_430 = 0x400;
  if (stream != (void *)0x0 && gentl != (shared_ptr<const_rcg::GenTLWrapper> *)0x0) {
    iVar1 = (**(code **)(*(long *)this + 0x170))
                      (gentl,stream,(ulong)buffer & 0xffffffff,&local_434,local_428,&local_430);
    if ((iVar1 == 0) && (local_434 == 1)) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string getBufferString(const std::shared_ptr<const GenTLWrapper> &gentl,
                                   void *stream, void *buffer, GenTL::BUFFER_INFO_CMD cmd)
{
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t size=sizeof(tmp);

  if (stream != 0 && buffer != 0)
  {
    if (gentl->DSGetBufferInfo(stream, buffer, cmd, &type, &tmp, &size) == GenTL::GC_ERR_SUCCESS)
    {
      if (type == GenTL::INFO_DATATYPE_STRING)
      {
        ret=tmp;
      }
    }
  }

  return ret;
}